

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

char * __thiscall MeCab::anon_unknown_0::LatticeImpl::toString(LatticeImpl *this,Node *node)

{
  char *pcVar1;
  LatticeImpl *in_RSI;
  Node *in_RDI;
  LatticeImpl *unaff_retaddr;
  StringBuffer *in_stack_ffffffffffffffd8;
  
  stream(unaff_retaddr);
  pcVar1 = toStringInternal(in_RSI,in_RDI,in_stack_ffffffffffffffd8);
  return pcVar1;
}

Assistant:

const char *LatticeImpl::toString(const Node *node) {
  return toStringInternal(node, stream());
}